

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O1

int convert_code_r(compiler_state_t *cstate,conv_state_t *conv_state,icode *ic,block *p)

{
  block *pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  void *__ptr;
  slist *psVar6;
  ulong uVar7;
  uint uVar8;
  size_t __nmemb;
  size_t sVar9;
  uint local_64;
  bpf_insn *local_60;
  
  if ((p != (block *)0x0) && (p->mark != ic->cur_mark)) {
    p->mark = ic->cur_mark;
    iVar4 = convert_code_r(cstate,conv_state,ic,(p->ef).succ);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = convert_code_r(cstate,conv_state,ic,(p->et).succ);
    if (iVar4 == 0) {
      return 0;
    }
    __nmemb = 0;
    for (psVar6 = p->stmts; iVar4 = (int)__nmemb, psVar6 != (slist *)0x0; psVar6 = psVar6->next) {
      __nmemb = (size_t)(iVar4 + (uint)((psVar6->s).code != -1));
    }
    local_60 = conv_state->ftail + -(ulong)(p->longjt + iVar4 + p->longjf + 1);
    conv_state->ftail = local_60;
    p->offset = (int)((ulong)((long)local_60 - (long)conv_state->fstart) >> 3);
    if (iVar4 == 0) {
      __ptr = (void *)0x0;
    }
    else {
      __ptr = calloc(__nmemb,8);
      if (__ptr == (void *)0x0) {
        bpf_error(cstate,"not enough core");
      }
    }
    psVar6 = p->stmts;
    if (psVar6 != (slist *)0x0 && iVar4 != 0) {
      uVar7 = 1;
      do {
        *(slist **)((long)__ptr + uVar7 * 8 + -8) = psVar6;
        if (__nmemb <= uVar7) break;
        psVar6 = psVar6->next;
        uVar7 = uVar7 + 1;
      } while (psVar6 != (slist *)0x0);
    }
    psVar6 = p->stmts;
    if (psVar6 != (slist *)0x0) {
      local_64 = 0;
      do {
        uVar5 = (psVar6->s).code;
        if (uVar5 != 0xffffffff) {
          local_60->code = (u_short)uVar5;
          local_60->k = (psVar6->s).k;
          if (((uVar5 != 5) && ((uVar5 & 7) == 5)) && (local_64 != iVar4 - 2U)) {
            if (((psVar6->s).jt == (slist *)0x0) || ((psVar6->s).jf == (slist *)0x0)) {
              bpf_error(cstate,"%s for block-local relative jump: off=%d","no jmp destination",
                        (ulong)local_64);
            }
            if (iVar4 == 0) {
LAB_00114cbd:
              bpf_error(cstate,"%s for block-local relative jump: off=%d","no destination found",
                        (ulong)local_64);
            }
            sVar9 = 0;
            bVar3 = false;
            bVar2 = false;
            do {
              if (*(slist **)((long)__ptr + sVar9 * 8) == (psVar6->s).jt) {
                if (bVar2) {
                  bpf_error(cstate,"%s for block-local relative jump: off=%d","multiple matches",
                            (ulong)local_64);
                }
                local_60->jt = (char)sVar9 + ~(byte)local_64;
                bVar2 = true;
              }
              if (*(slist **)((long)__ptr + sVar9 * 8) == (psVar6->s).jf) {
                if (bVar3) {
                  bpf_error(cstate,"%s for block-local relative jump: off=%d","multiple matches",
                            (ulong)local_64);
                }
                local_60->jf = (char)sVar9 + ~(byte)local_64;
                bVar3 = true;
              }
              sVar9 = sVar9 + 1;
            } while (__nmemb != sVar9);
            if (!bVar2 || !bVar3) goto LAB_00114cbd;
          }
          local_60 = local_60 + 1;
          local_64 = local_64 + 1;
        }
        psVar6 = psVar6->next;
      } while (psVar6 != (slist *)0x0);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    local_60->code = (u_short)(p->s).code;
    local_60->k = (p->s).k;
    pbVar1 = (p->et).succ;
    if (pbVar1 == (block *)0x0) {
      return 1;
    }
    uVar8 = ~(iVar4 + p->offset);
    uVar5 = pbVar1->offset + uVar8;
    if (uVar5 < 0x100) {
      local_60->jt = (u_char)uVar5;
      iVar4 = 0;
    }
    else {
      if (p->longjt == 0) {
        p->longjt = 1;
        return 0;
      }
      local_60->jt = '\0';
      local_60[1].code = 5;
      local_60[1].k = uVar5 - 1;
      iVar4 = 1;
    }
    uVar8 = uVar8 + ((p->ef).succ)->offset;
    if (uVar8 < 0x100) {
      local_60->jf = (u_char)uVar8;
    }
    else {
      if (p->longjf == 0) {
        p->longjf = 1;
        return 0;
      }
      local_60->jf = (u_char)iVar4;
      uVar5 = iVar4 + 1;
      local_60[uVar5].code = 5;
      local_60[uVar5].k = uVar8 - uVar5;
    }
  }
  return 1;
}

Assistant:

static int
convert_code_r(compiler_state_t *cstate, conv_state_t *conv_state,
    struct icode *ic, struct block *p)
{
	struct bpf_insn *dst;
	struct slist *src;
	u_int slen;
	u_int off;
	int extrajmps;		/* number of extra jumps inserted */
	struct slist **offset = NULL;

	if (p == 0 || isMarked(ic, p))
		return (1);
	Mark(ic, p);

	if (convert_code_r(cstate, conv_state, ic, JF(p)) == 0)
		return (0);
	if (convert_code_r(cstate, conv_state, ic, JT(p)) == 0)
		return (0);

	slen = slength(p->stmts);
	dst = conv_state->ftail -= (slen + 1 + p->longjt + p->longjf);
		/* inflate length by any extra jumps */

	p->offset = (int)(dst - conv_state->fstart);

	/* generate offset[] for convenience  */
	if (slen) {
		offset = (struct slist **)calloc(slen, sizeof(struct slist *));
		if (!offset) {
			bpf_error(cstate, "not enough core");
			/*NOTREACHED*/
		}
	}
	src = p->stmts;
	for (off = 0; off < slen && src; off++) {
#if 0
		printf("off=%d src=%x\n", off, src);
#endif
		offset[off] = src;
		src = src->next;
	}

	off = 0;
	for (src = p->stmts; src; src = src->next) {
		if (src->s.code == NOP)
			continue;
		dst->code = (u_short)src->s.code;
		dst->k = src->s.k;

		/* fill block-local relative jump */
		if (BPF_CLASS(src->s.code) != BPF_JMP || src->s.code == (BPF_JMP|BPF_JA)) {
#if 0
			if (src->s.jt || src->s.jf) {
				bpf_error(cstate, "illegal jmp destination");
				/*NOTREACHED*/
			}
#endif
			goto filled;
		}
		if (off == slen - 2)	/*???*/
			goto filled;

	    {
		u_int i;
		int jt, jf;
		const char *ljerr = "%s for block-local relative jump: off=%d";

#if 0
		printf("code=%x off=%d %x %x\n", src->s.code,
			off, src->s.jt, src->s.jf);
#endif

		if (!src->s.jt || !src->s.jf) {
			bpf_error(cstate, ljerr, "no jmp destination", off);
			/*NOTREACHED*/
		}

		jt = jf = 0;
		for (i = 0; i < slen; i++) {
			if (offset[i] == src->s.jt) {
				if (jt) {
					bpf_error(cstate, ljerr, "multiple matches", off);
					/*NOTREACHED*/
				}

				dst->jt = i - off - 1;
				jt++;
			}
			if (offset[i] == src->s.jf) {
				if (jf) {
					bpf_error(cstate, ljerr, "multiple matches", off);
					/*NOTREACHED*/
				}
				dst->jf = i - off - 1;
				jf++;
			}
		}
		if (!jt || !jf) {
			bpf_error(cstate, ljerr, "no destination found", off);
			/*NOTREACHED*/
		}
	    }
filled:
		++dst;
		++off;
	}
	if (offset)
		free(offset);

#ifdef BDEBUG
	bids[dst - conv_state->fstart] = p->id + 1;
#endif
	dst->code = (u_short)p->s.code;
	dst->k = p->s.k;
	if (JT(p)) {
		extrajmps = 0;
		off = JT(p)->offset - (p->offset + slen) - 1;
		if (off >= 256) {
		    /* offset too large for branch, must add a jump */
		    if (p->longjt == 0) {
		    	/* mark this instruction and retry */
			p->longjt++;
			return(0);
		    }
		    /* branch if T to following jump */
		    dst->jt = extrajmps;
		    extrajmps++;
		    dst[extrajmps].code = BPF_JMP|BPF_JA;
		    dst[extrajmps].k = off - extrajmps;
		}
		else
		    dst->jt = off;
		off = JF(p)->offset - (p->offset + slen) - 1;
		if (off >= 256) {
		    /* offset too large for branch, must add a jump */
		    if (p->longjf == 0) {
		    	/* mark this instruction and retry */
			p->longjf++;
			return(0);
		    }
		    /* branch if F to following jump */
		    /* if two jumps are inserted, F goes to second one */
		    dst->jf = extrajmps;
		    extrajmps++;
		    dst[extrajmps].code = BPF_JMP|BPF_JA;
		    dst[extrajmps].k = off - extrajmps;
		}
		else
		    dst->jf = off;
	}
	return (1);
}